

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseVisitor.hpp
# Opt level: O2

string * __thiscall
OpenMD::BaseVisitor::toString_abi_cxx11_(string *__return_storage_ptr__,BaseVisitor *this)

{
  char buffer [65535];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memcpy(buffer,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(buffer,0xffff,"Visitor name: %s\n",(this->visitorName)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  memcpy(buffer,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual const std::string toString() {
      std::string result;
      char buffer[65535];

      snprintf(buffer, 65535,
               "--------------------------------------------------------"
               "----------\n");
      result += buffer;

      snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
      result += buffer;

      snprintf(buffer, 65535,
               "--------------------------------------------------------"
               "----------\n");
      result += buffer;

      return result;
    }